

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_alphamapblit_argb32
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  ClipLine *pCVar1;
  long lVar2;
  uchar *puVar3;
  QT_FT_Span *pQVar4;
  int iVar5;
  int iVar6;
  uint c;
  int iVar7;
  ulong uVar8;
  long lVar9;
  uchar *puVar10;
  int iVar11;
  quint32 *dest;
  long lVar12;
  long in_FS_OFFSET;
  QColorTrcLut *local_80;
  QRgba64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  c = QRgba64::toArgb32(color);
  if (color->rgba >> 0x30 != 0) {
    uVar8 = rasterBuffer->bytes_per_line;
    if (useGammaCorrection) {
      local_80 = QGuiApplicationPrivate::colorProfileForA8Text(QGuiApplicationPrivate::self);
      local_40 = (QRgba64)color->rgba;
      if (local_80 == (QColorTrcLut *)0x0) {
        local_80 = (QColorTrcLut *)0x0;
      }
      else if ((short)(local_40.rgba >> 0x30) == -1) {
        local_40 = QColorTrcLut::toLinear(local_80,local_40);
      }
    }
    else {
      local_80 = (QColorTrcLut *)0x0;
      local_40.rgba = color->rgba;
    }
    if (clip == (QClipData *)0x0) {
      dest = (quint32 *)
             (rasterBuffer->m_buffer + (long)x * 4 + (long)y * rasterBuffer->bytes_per_line);
      for (; 0 < mapHeight; mapHeight = mapHeight + -1) {
        qt_alphamapblit_argb32_oneline(map,mapWidth,&local_40,dest,c,local_80);
        map = map + mapStride;
        dest = dest + (int)(uVar8 >> 2);
      }
    }
    else {
      iVar5 = mapHeight + y;
      if (rasterBuffer->m_height <= mapHeight + y) {
        iVar5 = rasterBuffer->m_height;
      }
      uVar8 = 0;
      if (0 < y) {
        uVar8 = (ulong)(uint)y;
      }
      puVar10 = map + ((int)uVar8 - y) * mapStride;
      QClipData::initialize(clip);
      for (; (long)uVar8 < (long)iVar5; uVar8 = uVar8 + 1) {
        pCVar1 = clip->m_clipLines;
        lVar2 = rasterBuffer->bytes_per_line;
        puVar3 = rasterBuffer->m_buffer;
        lVar12 = 4;
        for (lVar9 = 0; lVar9 < pCVar1[uVar8].count; lVar9 = lVar9 + 1) {
          pQVar4 = pCVar1[uVar8].spans;
          iVar7 = *(int *)((long)pQVar4 + lVar12 + -4);
          iVar6 = x;
          if (x < iVar7) {
            iVar6 = iVar7;
          }
          iVar7 = iVar7 + *(int *)((long)&pQVar4->x + lVar12);
          iVar11 = mapWidth + x;
          if (iVar7 <= mapWidth + x) {
            iVar11 = iVar7;
          }
          qt_alphamapblit_argb32_oneline
                    (puVar10 + ((long)iVar6 - (long)x),iVar11 - iVar6,&local_40,
                     (quint32 *)(puVar3 + (long)iVar6 * 4 + lVar2 * uVar8),c,local_80);
          lVar12 = lVar12 + 0x10;
        }
        puVar10 = puVar10 + mapStride;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_argb32(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride,
                                   const QClipData *clip, bool useGammaCorrection)
{
    const quint32 c = color.toArgb32();
    const int destStride = rasterBuffer->stride<quint32>();

    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    if (!clip) {
        quint32 *dest = reinterpret_cast<quint32*>(rasterBuffer->scanLine(y)) + x;
        while (--mapHeight >= 0) {
            qt_alphamapblit_argb32_oneline(map, mapWidth, srcColor, dest, c, colorProfile);
            dest += destStride;
            map += mapStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            quint32 *dest = reinterpret_cast<quint32 *>(rasterBuffer->scanLine(yp));

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];
                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                qt_alphamapblit_argb32_oneline(map + start - x, end - start, srcColor, dest + start, c, colorProfile);
            } // for (yp -> bottom)
            map += mapStride;
        }
    }
}